

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

TestReturnValue __thiscall
embree::MemoryMonitorTest::run(MemoryMonitorTest *this,VerifyApplication *state,bool silent)

{
  _func_int **pp_Var1;
  bool bVar2;
  undefined8 uVar3;
  RTCDevice pRVar4;
  __int_type _Var5;
  ulong uVar6;
  byte in_DL;
  VerifyApplication *in_RSI;
  Test *in_RDI;
  float fVar7;
  float fVar8;
  char *in_stack_00000010;
  RTCError in_stack_0000001c;
  void *in_stack_00000020;
  RegressionTask task2;
  RegressionTask task1;
  uint sceneIndex;
  RTCDeviceRef device;
  string cfg;
  value_type *in_stack_fffffffffffffe48;
  vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_> *in_stack_fffffffffffffe50;
  RegressionTask *in_stack_fffffffffffffe58;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  float in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  ThreadRegressionTask *in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffecc;
  RegressionTask local_f0;
  uint local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  RTCDeviceRef local_98 [3];
  string local_80 [32];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  VerifyApplication *local_18;
  TestReturnValue local_4;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  std::operator+(in_stack_fffffffffffffe78,
                 (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  stringOfISA_abi_cxx11_(in_stack_fffffffffffffecc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  uVar3 = std::__cxx11::string::c_str();
  pRVar4 = (RTCDevice)rtcNewDevice(uVar3);
  RTCDeviceRef::RTCDeviceRef(local_98,pRVar4);
  pRVar4 = RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_98);
  rtcGetDeviceError(pRVar4);
  errorHandler(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  local_9c = 1;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::push_back
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_a0 = 2;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::push_back
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_a4 = 3;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::push_back
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_a8 = 4;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::push_back
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pRVar4 = RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_98);
  rtcSetDeviceMemoryMonitorFunction(pRVar4,monitorMemoryFunction,0);
  local_ac = 0;
  do {
    fVar7 = *(float *)&in_RDI[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
            local_18->intensity;
    uVar6 = (ulong)fVar7;
    if ((uVar6 | (long)(fVar7 - 9.223372e+18) & (long)uVar6 >> 0x3f) <= (ulong)local_ac) {
      pRVar4 = RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_98);
      rtcSetDeviceMemoryMonitorFunction(pRVar4,0);
      RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_98);
      AssertNoError((RTCDevice)in_stack_fffffffffffffea0);
      local_4 = PASSED;
      break;
    }
    monitorMemoryBreak = std::numeric_limits<unsigned_long>::max();
    std::__atomic_base<unsigned_long>::operator=
              (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
    std::__atomic_base<unsigned_long>::operator=
              (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
    std::__atomic_base<unsigned_long>::operator=
              (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
    monitorProgressBreak = std::numeric_limits<unsigned_long>::max();
    std::__atomic_base<unsigned_long>::operator=
              (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
    std::__atomic_base<unsigned_long>::operator=
              (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
    RegressionTask::RegressionTask
              ((RegressionTask *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (Test *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (uint)in_stack_fffffffffffffe84,(uint)in_stack_fffffffffffffe80,
               (uint)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
    pp_Var1 = in_RDI[1].super_RefCount._vptr_RefCount;
    in_stack_fffffffffffffea0 = (ThreadRegressionTask *)operator_new(0x28);
    ThreadRegressionTask::ThreadRegressionTask
              (in_stack_fffffffffffffea0,0,0,local_18,local_98,
               (vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_> *)
               &in_RDI[1].name,&local_f0);
    (*(code *)pp_Var1)(in_stack_fffffffffffffea0);
    _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
    if (_Var5 == 0) {
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe90 = (float)(long)_Var5;
      in_stack_fffffffffffffe88 = (float)_Var5;
      in_stack_fffffffffffffe94 = in_stack_fffffffffffffe88;
      in_stack_fffffffffffffe8c = VerifyApplication::Test::random_float(in_RDI);
      uVar6 = (ulong)(in_stack_fffffffffffffe88 * in_stack_fffffffffffffe8c);
      monitorMemoryBreak =
           uVar6 | (long)(in_stack_fffffffffffffe88 * in_stack_fffffffffffffe8c - 9.223372e+18) &
                   (long)uVar6 >> 0x3f;
      in_stack_fffffffffffffe78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__atomic_base<unsigned_long>::operator=
                (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
      std::__atomic_base<unsigned_long>::operator=
                (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
      std::__atomic_base<unsigned_long>::operator=
                (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe80 = (float)(long)_Var5;
      in_stack_fffffffffffffe84 = (float)_Var5;
      fVar7 = in_stack_fffffffffffffe84 + in_stack_fffffffffffffe84;
      fVar8 = VerifyApplication::Test::random_float(in_RDI);
      uVar6 = (ulong)(fVar7 * fVar8);
      monitorProgressBreak = uVar6 | (long)(fVar7 * fVar8 - 9.223372e+18) & (long)uVar6 >> 0x3f;
      in_stack_fffffffffffffe60 = (__atomic_base<unsigned_long> *)0x0;
      std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)0x0,(__int_type)in_stack_fffffffffffffe58);
      std::__atomic_base<unsigned_long>::operator=
                (in_stack_fffffffffffffe60,(__int_type)in_stack_fffffffffffffe58);
      RegressionTask::RegressionTask
                ((RegressionTask *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (Test *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (uint)in_stack_fffffffffffffe84,(uint)in_stack_fffffffffffffe80,
                 (uint)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
      in_stack_fffffffffffffe50 =
           (vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_> *)
           in_RDI[1].super_RefCount._vptr_RefCount;
      in_stack_fffffffffffffe58 = (RegressionTask *)operator_new(0x28);
      ThreadRegressionTask::ThreadRegressionTask
                ((ThreadRegressionTask *)in_stack_fffffffffffffe58,0,0,local_18,local_98,
                 (vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_> *)
                 &in_RDI[1].name,(RegressionTask *)&stack0xfffffffffffffec8);
      (*(code *)in_stack_fffffffffffffe50)(in_stack_fffffffffffffe58);
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
      if (_Var5 == 0) {
        _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
        if ((_Var5 == 0) ||
           (_Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58),
           _Var5 == 1)) {
          _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
          if ((_Var5 == 0) ||
             (_Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                                ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58),
             _Var5 == 1)) {
            _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58);
            if (((_Var5 == 0) &&
                (_Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                                   ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58),
                _Var5 == 0)) &&
               (_Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe58),
               _Var5 != 0)) {
              local_4 = FAILED;
              bVar2 = true;
            }
            else {
              local_ac = local_ac + 1;
              bVar2 = false;
            }
          }
          else {
            local_4 = FAILED;
            bVar2 = true;
          }
        }
        else {
          local_4 = FAILED;
          bVar2 = true;
        }
      }
      else {
        local_4 = FAILED;
        bVar2 = true;
      }
      RegressionTask::~RegressionTask(in_stack_fffffffffffffe58);
    }
    else {
      local_4 = FAILED;
      bVar2 = true;
    }
    RegressionTask::~RegressionTask(in_stack_fffffffffffffe58);
  } while (!bVar2);
  RTCDeviceRef::~RTCDeviceRef((RTCDeviceRef *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      
      /* only test supported intersect modes */
      intersectModes.push_back(MODE_INTERSECT1);
      intersectModes.push_back(MODE_INTERSECT4);
      intersectModes.push_back(MODE_INTERSECT8);
      intersectModes.push_back(MODE_INTERSECT16);
      
      rtcSetDeviceMemoryMonitorFunction(device,monitorMemoryFunction,nullptr);
      
      unsigned int sceneIndex = 0;
      while (sceneIndex < size_t(intensity*state->intensity)) 
      {
        monitorMemoryBreak = std::numeric_limits<size_t>::max();
        monitorMemoryBytesUsed = 0;
        monitorMemoryInvokations = 0;
        monitorMemoryBreakExecuted = 0;
        monitorProgressBreak = std::numeric_limits<size_t>::max();
        monitorProgressInvokations = 0;
        monitorProgressBreakExecuted = 0;
        RegressionTask task1(this,sceneIndex,1,0,true);
        func(new ThreadRegressionTask(0,0,state,device,intersectModes,&task1));
        if (monitorMemoryBytesUsed) 
          return VerifyApplication::FAILED;

        monitorMemoryBreak = size_t(float(monitorMemoryInvokations) * random_float());
        monitorMemoryBytesUsed = 0;
        monitorMemoryInvokations = 0;
        monitorMemoryBreakExecuted = 0;
        monitorProgressBreak = size_t(float(monitorProgressInvokations) * 2.0f * random_float());
        monitorProgressInvokations = 0;
        monitorProgressBreakExecuted = 0;
        RegressionTask task2(this,sceneIndex,1,0,true);
        func(new ThreadRegressionTask(0,0,state,device,intersectModes,&task2));
        if (monitorMemoryBytesUsed) 
          return VerifyApplication::FAILED;
        if (monitorMemoryBreakExecuted && task2.errorCounter != 1) 
          return VerifyApplication::FAILED;
        if (monitorProgressBreakExecuted && task2.errorCounter != 1) 
          return VerifyApplication::FAILED;
        if (!monitorMemoryBreakExecuted && !monitorProgressBreakExecuted && task2.errorCounter != 0) 
          return VerifyApplication::FAILED;
        sceneIndex++;
      }
      rtcSetDeviceMemoryMonitorFunction(device,nullptr,nullptr);
      AssertNoError(device);
      return VerifyApplication::PASSED;
    }